

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl.h
# Opt level: O0

void a__GLProgramBind(AGLProgram program,AGLProgramUniform *uniforms,int nuniforms)

{
  int iVar1;
  GLint local_24;
  int loc;
  int texture_unit;
  int i;
  int nuniforms_local;
  AGLProgramUniform *uniforms_local;
  AGLProgram program_local;
  
  local_24 = 0;
  glUseProgram(program);
  for (loc = 0; loc < nuniforms; loc = loc + 1) {
    iVar1 = uniforms[loc]._.location;
    if (iVar1 != -1) {
      switch(uniforms[loc].type) {
      case AGLAT_Float:
        glUniform1fv(iVar1,uniforms[loc].count,uniforms[loc].value.pf);
        break;
      case AGLAT_Vec2:
        glUniform2fv(iVar1,uniforms[loc].count,uniforms[loc].value.pf);
        break;
      case AGLAT_Vec3:
        glUniform3fv(iVar1,uniforms[loc].count,uniforms[loc].value.pf);
        break;
      case AGLAT_Vec4:
        glUniform4fv(iVar1,uniforms[loc].count,uniforms[loc].value.pf);
        break;
      case AGLAT_Mat2:
        glUniformMatrix2fv(iVar1,uniforms[loc].count,0,uniforms[loc].value.pf);
        break;
      case AGLAT_Mat3:
        glUniformMatrix3fv(iVar1,uniforms[loc].count,0,uniforms[loc].value.pf);
        break;
      case AGLAT_Mat4:
        glUniformMatrix4fv(iVar1,uniforms[loc].count,0,uniforms[loc].value.pf);
        break;
      case AGLAT_Int:
        glUniform1iv(iVar1,uniforms[loc].count,uniforms[loc].value.pf);
        break;
      case AGLAT_IVec2:
        glUniform2iv(iVar1,uniforms[loc].count,uniforms[loc].value.pf);
        break;
      case AGLAT_IVec3:
        glUniform3iv(iVar1,uniforms[loc].count,uniforms[loc].value.pf);
        break;
      case AGLAT_IVec4:
        glUniform4iv(iVar1,uniforms[loc].count,uniforms[loc].value.pf);
        break;
      case AGLAT_Texture:
        a__GLTextureBind(uniforms[loc].value.texture,local_24);
        glUniform1i(iVar1,local_24);
        local_24 = local_24 + 1;
      }
    }
  }
  return;
}

Assistant:

void a__GLProgramBind(AGLProgram program, const AGLProgramUniform *uniforms, int nuniforms) {
	ATTO_GL_PROFILE_START
	int i, texture_unit = 0;
	AGL__CALL(glUseProgram(program));
	for (i = 0; i < nuniforms; ++i) {
		ATTO_GL_PROFILE_START
		const int loc = uniforms[i]._.location;
		if (loc == -1) { /*AGL_PRINTFLN("Skipping %s", uniforms[i].name);*/
			continue;
		}
		switch (uniforms[i].type) {
		case AGLAT_Float: AGL__CALL(glUniform1fv(loc, uniforms[i].count, uniforms[i].value.pf)); break;
		case AGLAT_Vec2: AGL__CALL(glUniform2fv(loc, uniforms[i].count, uniforms[i].value.pf)); break;
		case AGLAT_Vec3: AGL__CALL(glUniform3fv(loc, uniforms[i].count, uniforms[i].value.pf)); break;
		case AGLAT_Vec4: AGL__CALL(glUniform4fv(loc, uniforms[i].count, uniforms[i].value.pf)); break;
		case AGLAT_Mat2: AGL__CALL(glUniformMatrix2fv(loc, uniforms[i].count, GL_FALSE, uniforms[i].value.pf)); break;
		case AGLAT_Mat3: AGL__CALL(glUniformMatrix3fv(loc, uniforms[i].count, GL_FALSE, uniforms[i].value.pf)); break;
		case AGLAT_Mat4: AGL__CALL(glUniformMatrix4fv(loc, uniforms[i].count, GL_FALSE, uniforms[i].value.pf)); break;
		case AGLAT_Int: AGL__CALL(glUniform1iv(loc, uniforms[i].count, uniforms[i].value.pi)); break;
		case AGLAT_IVec2: AGL__CALL(glUniform2iv(loc, uniforms[i].count, uniforms[i].value.pi)); break;
		case AGLAT_IVec3: AGL__CALL(glUniform3iv(loc, uniforms[i].count, uniforms[i].value.pi)); break;
		case AGLAT_IVec4: AGL__CALL(glUniform4iv(loc, uniforms[i].count, uniforms[i].value.pi)); break;
		case AGLAT_Texture:
			a__GLTextureBind(uniforms[i].value.texture, texture_unit);
			AGL__CALL(glUniform1i(loc, texture_unit));
			++texture_unit;
		}
		ATTO_GL_PROFILE_END_NAME("per uniform")
	}
	ATTO_GL_PROFILE_END
}